

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

uint8_t * __thiscall DTSStreamReader::findFrame(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint64_t uVar1;
  uint8_t *local_60;
  uint8_t *p_buf_1;
  uint8_t *p_buf;
  ulong local_48;
  uint64_t hdrSize;
  uint64_t local_38;
  uint64_t hdrType;
  int64_t *ptr;
  uint8_t *end_local;
  uint8_t *buff_local;
  DTSStreamReader *this_local;
  
  ptr = (int64_t *)end;
  end_local = buff;
  buff_local = (uint8_t *)this;
  do {
    if ((long)ptr - (long)end_local < 0x10) {
LAB_00295fad:
      if ((this->m_firstCall & 1U) != 0) {
        this->m_firstCall = false;
        checkIfOnlyHDDataExists(this,end_local,(uint8_t *)ptr);
      }
      if ((this->m_isCoreExists & 1U) == 0) {
        for (p_buf_1 = end_local; p_buf_1 < (uint8_t *)((long)ptr - 4U); p_buf_1 = p_buf_1 + 1) {
          if ((((*p_buf_1 == 'd') && (p_buf_1[1] == 'X')) && (p_buf_1[2] == ' ')) &&
             (p_buf_1[3] == '%')) {
            return p_buf_1;
          }
        }
      }
      else {
        for (local_60 = end_local; local_60 < (uint8_t *)((long)ptr + -4); local_60 = local_60 + 1)
        {
          if (local_60 < (uint8_t *)((long)ptr + -6)) {
            if ((((*local_60 == 0xff) && (local_60[1] == '\x1f')) && (local_60[2] == '\0')) &&
               (((local_60[3] == 0xe8 && ((local_60[4] & 0xf0) == 0xf0)) && (local_60[5] == '\a'))))
            {
              return local_60;
            }
            if (((*local_60 == '\x1f') && (local_60[1] == 0xff)) &&
               ((local_60[2] == 0xe8 &&
                (((local_60[3] == '\0' && (local_60[4] == '\a')) && ((local_60[5] & 0xf0) == 0xf0)))
                ))) {
              return local_60;
            }
          }
          if (((*local_60 == '\x7f') && (local_60[1] == 0xfe)) &&
             ((local_60[2] == 0x80 && (local_60[3] == '\x01')))) {
            return local_60;
          }
          if (((*local_60 == 0xfe) && (local_60[1] == '\x7f')) &&
             ((local_60[2] == '\x01' && (local_60[3] == 0x80)))) {
            return local_60;
          }
        }
      }
      return (uint8_t *)0x0;
    }
    hdrType = (uint64_t)end_local;
    hdrSize = *(uint64_t *)end_local;
    local_38 = my_ntohll(&hdrSize);
    p_buf = *(uint8_t **)(hdrType + 8);
    uVar1 = my_ntohll((uint64_t *)&p_buf);
    local_48 = uVar1 + 0x10;
    if (0x2000000000000000 < local_48) goto LAB_00295fad;
    if ((((local_38 == 0x41555052494e464f) || (local_38 == 0x4249545348565442)) ||
        (local_38 == 0x424c41434b4f5554)) ||
       (((((local_38 == 0x4252414e43485054 || (local_38 == 0x4255494c44564552)) ||
          ((local_38 == 0x434f524553534d44 ||
           ((local_38 == 0x45585453535f4d44 || (local_38 == 0x46494c45494e464f)))))) ||
         (local_38 == 0x4e4156492d54424c)) ||
        ((local_38 == 0x54494d45434f4445 || (local_38 == 0x4454534844484452)))))) {
      if ((ulong)((long)ptr - (long)end_local) < local_48) {
        return (uint8_t *)0x0;
      }
    }
    else {
      if (local_38 != 0x415550522d484452) {
        if (local_38 == 0x5354524d44415441) {
          end_local = end_local + 0x10;
        }
        goto LAB_00295fad;
      }
      if (ptr < end_local + local_48) {
        return (uint8_t *)0x0;
      }
      this->m_skippingSamples = (uint)end_local[0x23] * 0x100 + (uint)end_local[0x24];
    }
    end_local = end_local + local_48;
  } while( true );
}

Assistant:

uint8_t* DTSStreamReader::findFrame(uint8_t* buff, uint8_t* end)
{
    // check for DTS-HD headers
    while (end - buff >= 16)
    {
        const auto ptr = reinterpret_cast<int64_t*>(buff);
        const uint64_t hdrType = my_ntohll(ptr[0]);
        const uint64_t hdrSize = my_ntohll(ptr[1]) + 16;

        if (hdrSize > static_cast<uint64_t>(1) << 61)
            break;

        if (hdrType == AUPRINFO || hdrType == BITSHVTB || hdrType == BLACKOUT || hdrType == BRANCHPT ||
            hdrType == BUILDVER || hdrType == CORESSMD || hdrType == EXTSS_MD || hdrType == FILEINFO ||
            hdrType == NAVI_TBL || hdrType == TIMECODE || hdrType == DTSHDHDR)
        {
            if (hdrSize > static_cast<size_t>(end - buff))
                return nullptr;  // need more data
            buff += hdrSize;
        }
        else if (hdrType == AUPR_HDR)
        {
            if (buff + hdrSize > end)
                return nullptr;  // need more data
            // determine skipping frames amount
            m_skippingSamples = (buff[35] << 8) + buff[36];
            buff += hdrSize;
        }
        else if (hdrType == STRMDATA)
        {
            // m_dataSegmentLen = hdrSize;
            buff += 16;
            break;
        }
        else
        {
            break;  // no more HD headers
        }
    }

    if (m_firstCall)
    {
        m_firstCall = false;
        checkIfOnlyHDDataExists(buff, end);
    }

    if (!m_isCoreExists)
    {
        // if not core exists find HD frames directly
        for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
        {
            if (p_buf[0] == 0x64 && p_buf[1] == 0x58 && p_buf[2] == 0x20 && p_buf[3] == 0x25)
            {
                return p_buf;
            }
        }
        return nullptr;
    }

    for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
    {
        if (p_buf < end - 6)
        {
            if (p_buf[0] == 0xff && p_buf[1] == 0x1f && p_buf[2] == 0x00 && p_buf[3] == 0xe8 &&
                (p_buf[4] & 0xf0) == 0xf0 && p_buf[5] == 0x07)
            {
                return p_buf;
            }
            // 14 bits, big endian version of the bitstream
            if (p_buf[0] == 0x1f && p_buf[1] == 0xff && p_buf[2] == 0xe8 && p_buf[3] == 0x00 && p_buf[4] == 0x07 &&
                (p_buf[5] & 0xf0) == 0xf0)
            {
                return p_buf;
            }
        }
        // 16 bits, big endian version of the bitstream
        if (p_buf[0] == 0x7f && p_buf[1] == 0xfe && p_buf[2] == 0x80 && p_buf[3] == 0x01)
        {
            return p_buf;
        }
        // 16 bits, little endian version of the bitstream
        if (p_buf[0] == 0xfe && p_buf[1] == 0x7f && p_buf[2] == 0x01 && p_buf[3] == 0x80)
        {
            return p_buf;
        }
    }
    return nullptr;
}